

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O1

void __thiscall
MinVR::VRHeadTrackingNode::render
          (VRHeadTrackingNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_88;
  string local_68;
  string local_48;
  
  VRDataIndex::pushState(renderState);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"HeadMatrix","");
  VRDataIndex::addData
            (&local_48,renderState,&local_88,&(this->_headMatrix).super_VRFloatArrayConvertible);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CameraMatrix","");
  VRDataIndex::addData
            (&local_68,renderState,&local_88,&(this->_headMatrix).super_VRFloatArrayConvertible);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void
VRHeadTrackingNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	renderState->addData("HeadMatrix", _headMatrix);

  // We copy the head matrix into "CameraMatrix" in case this is only a mono
  // configuration and the two are the same thing.  We don't use a link because
  // a stereo configuration will overwrite the camera matrix.
	renderState->addData("CameraMatrix", _headMatrix);
	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}